

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_aggregate.cpp
# Opt level: O0

void duckdb::RowOperations::InitializeStates
               (TupleDataLayout *layout,Vector *addresses,SelectionVector *sel,idx_t count)

{
  aggregate_initialize_t p_Var1;
  bool bVar2;
  reference this;
  idx_t iVar3;
  const_reference pvVar4;
  ulong in_RCX;
  SelectionVector *in_RDX;
  TupleDataLayout *in_RDI;
  uchar *row;
  idx_t row_idx;
  idx_t i;
  AggregateObject *aggr;
  iterator __end1;
  iterator __begin1;
  Aggregates *__range1;
  idx_t aggr_idx;
  vector<unsigned_long,_true> *offsets;
  uchar **pointers;
  vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
  *in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff80;
  ulong local_60;
  __normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
  local_48;
  Aggregates *local_40;
  idx_t local_38;
  vector<unsigned_long,_true> *local_30;
  uchar **local_28;
  ulong local_20;
  SelectionVector *local_18;
  TupleDataLayout *local_8;
  
  if (in_RCX != 0) {
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_8 = in_RDI;
    local_28 = FlatVector::GetData<unsigned_char*>((Vector *)0x158cdc5);
    local_30 = TupleDataLayout::GetOffsets(local_8);
    local_38 = TupleDataLayout::ColumnCount((TupleDataLayout *)0x158cde9);
    local_40 = TupleDataLayout::GetAggregates(local_8);
    local_48._M_current =
         (AggregateObject *)
         ::std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>::begin
                   (in_stack_ffffffffffffff78);
    ::std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>::end
              (in_stack_ffffffffffffff78);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
                               *)in_stack_ffffffffffffff78), bVar2) {
      this = __gnu_cxx::
             __normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
             ::operator*(&local_48);
      for (local_60 = 0; local_60 < local_20; local_60 = local_60 + 1) {
        iVar3 = SelectionVector::get_index(local_18,local_60);
        in_stack_ffffffffffffff78 =
             (vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_> *)
             local_28[iVar3];
        p_Var1 = (this->function).initialize;
        in_stack_ffffffffffffff80 = this;
        pvVar4 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)this,(size_type)in_stack_ffffffffffffff78
                           );
        (*p_Var1)(&in_stack_ffffffffffffff80->function,
                  (data_ptr_t)
                  ((long)&(in_stack_ffffffffffffff78->
                          super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                          )._M_impl.super__Vector_impl_data._M_start + *pvVar4));
      }
      local_38 = local_38 + 1;
      __gnu_cxx::
      __normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
      ::operator++(&local_48);
    }
  }
  return;
}

Assistant:

void RowOperations::InitializeStates(TupleDataLayout &layout, Vector &addresses, const SelectionVector &sel,
                                     idx_t count) {
	if (count == 0) {
		return;
	}
	auto pointers = FlatVector::GetData<data_ptr_t>(addresses);
	auto &offsets = layout.GetOffsets();
	auto aggr_idx = layout.ColumnCount();

	for (const auto &aggr : layout.GetAggregates()) {
		for (idx_t i = 0; i < count; ++i) {
			auto row_idx = sel.get_index(i);
			auto row = pointers[row_idx];
			aggr.function.initialize(aggr.function, row + offsets[aggr_idx]);
		}
		++aggr_idx;
	}
}